

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_descriptor_pk
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  
  iVar1 = generate_by_miniscript_pk_k(node,parent,derive_child_num,script,script_len,write_len);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = generate_by_wrapper_c(script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_descriptor_pk(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;

    ret = generate_by_miniscript_pk_k(node, parent, derive_child_num, script, script_len, write_len);
    if (ret != WALLY_OK)
        return ret;

    return generate_by_wrapper_c(script, script_len, write_len);
}